

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsonpath_selector.hpp
# Opt level: O2

reference __thiscall
jsoncons::jsonpath::detail::
parent_node_selector<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
::evaluate(parent_node_selector<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
           *this,eval_context<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
                 *context,reference root,path_node_type *last,reference param_4,
          result_options options,error_code *ec)

{
  supertype *psVar1;
  reference pbVar2;
  undefined4 extraout_var;
  reference pbVar3;
  int iVar4;
  
  for (iVar4 = 0; (last != (basic_path_node<wchar_t> *)0x0 && (iVar4 < this->ancestor_depth_));
      iVar4 = iVar4 + 1) {
    last = last->parent_;
  }
  if (last != (basic_path_node<wchar_t> *)0x0) {
    pbVar2 = select<jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>const>
                       (root,last);
    if (pbVar2 != (basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> *)0x0) {
      psVar1 = (this->
               super_base_selector<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
               ).tail_;
      if (psVar1 != (supertype *)0x0) {
        iVar4 = (*psVar1->_vptr_jsonpath_selector[3])(psVar1,context,root,last,pbVar2,options,ec);
        pbVar2 = (reference)CONCAT44(extraout_var,iVar4);
      }
      return pbVar2;
    }
  }
  pbVar3 = eval_context<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
           ::null_value(context);
  return pbVar3;
}

Assistant:

reference evaluate(eval_context<Json,JsonReference>& context,
                           reference root,
                           const path_node_type& last, 
                           reference, 
                           result_options options,
                           std::error_code& ec) const override
        {
            const path_node_type* ancestor = std::addressof(last);
            int index = 0;
            while (ancestor != nullptr && index < ancestor_depth_)
            {
                ancestor = ancestor->parent();
                ++index;
            }

            if (ancestor != nullptr)
            {
                pointer ptr = jsoncons::jsonpath::select(root, *ancestor);
                if (ptr != nullptr)
                {
                    return this->evaluate_tail(context, root, *ancestor, *ptr, options, ec);
                }
                return context.null_value();
            }
            return context.null_value();
        }